

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O0

void __thiscall shaping_clipper::set_oversample(shaping_clipper *this,int oversample)

{
  int *piVar1;
  PFFFT_Setup *pPVar2;
  double dVar3;
  int local_18;
  int local_14;
  shaping_clipper *psStack_10;
  int oversample_local;
  shaping_clipper *this_local;
  
  local_18 = 1;
  local_14 = oversample;
  psStack_10 = this;
  piVar1 = std::min<int>(&this->max_oversample,&local_14);
  piVar1 = std::max<int>(&local_18,piVar1);
  local_14 = *piVar1;
  dVar3 = log2((double)local_14);
  local_14 = 1 << ((byte)(int)dVar3 & 0x1f);
  if (local_14 != this->oversample) {
    if (this->pffft_oversampled != (PFFFT_Setup *)0x0) {
      pffft_destroy_setup(this->pffft_oversampled);
      this->pffft_oversampled = (PFFFT_Setup *)0x0;
    }
    if (1 < local_14) {
      pPVar2 = pffft_new_setup(this->size * local_14,PFFFT_REAL);
      this->pffft_oversampled = pPVar2;
    }
  }
  this->oversample = local_14;
  return;
}

Assistant:

void shaping_clipper::set_oversample(int oversample) {
    oversample = std::max(1, std::min(this->max_oversample, oversample));
    oversample = 1 << (int)log2(oversample);
    if (oversample != this->oversample) {
        if (this->pffft_oversampled) {
            pffft_destroy_setup(this->pffft_oversampled);
            this->pffft_oversampled = NULL;
        }
        if (oversample > 1) {
            this->pffft_oversampled = pffft_new_setup(this->size * oversample, PFFFT_REAL);
        }
    }
    this->oversample = oversample;
}